

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void __thiscall kj::UnixEventPort::ChildSet::checkExits(ChildSet *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  char *pcVar4;
  long *plVar5;
  __pid_t _Var6;
  int iVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  int status;
  Fault f;
  int local_54;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  p_Var1 = &(this->waiters)._M_t._M_impl.super__Rb_tree_header;
LAB_004bde4b:
  _Var6 = waitpid(-1,&local_54,1);
  if (_Var6 < 0) goto code_r0x004bde63;
  iVar7 = 0;
  goto LAB_004bde78;
code_r0x004bde63:
  iVar7 = kj::_::Debug::getOsErrorNumber(false);
  if (iVar7 != -1) {
LAB_004bde78:
    if (iVar7 != 0) {
      if (iVar7 == 10) {
        return;
      }
      local_50.exception = (Exception *)0x0;
      local_48 = 0;
      uStack_40 = 0;
      kj::_::Debug::Fault::init
                (&local_50,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_50);
    }
    if (_Var6 == 0) {
      return;
    }
    p_Var2 = (this->waiters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < _Var6]) {
      if (_Var6 <= (int)*(size_t *)(p_Var2 + 1)) {
        p_Var8 = p_Var2;
      }
    }
    p_Var9 = p_Var1;
    if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
       (p_Var9 = (_Rb_tree_header *)p_Var8, _Var6 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)
       ) {
      p_Var9 = p_Var1;
    }
    if (p_Var9 != p_Var1) {
      lVar3 = *(long *)(p_Var9 + 1);
      pcVar4 = *(char **)(lVar3 + 0x10);
      if (*pcVar4 == '\x01') {
        *pcVar4 = '\0';
      }
      plVar5 = *(long **)(lVar3 + 0x18);
      local_48 = CONCAT44(local_48._4_4_,local_54);
      (**(code **)(*plVar5 + 0x10))(plVar5,&local_48);
    }
  }
  goto LAB_004bde4b;
}

Assistant:

void UnixEventPort::ChildSet::checkExits() {
  for (;;) {
    int status;
    pid_t pid;
    KJ_SYSCALL_HANDLE_ERRORS(pid = waitpid(-1, &status, WNOHANG)) {
      case ECHILD:
        return;
      default:
        KJ_FAIL_SYSCALL("waitpid()", error);
    }
    if (pid == 0) break;

    auto iter = waiters.find(pid);
    if (iter != waiters.end()) {
      iter->second->pidRef = kj::none;
      iter->second->fulfiller.fulfill(kj::cp(status));
    }
  }
}